

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QModelIndex * __thiscall
QListViewPrivate::closestIndex
          (QModelIndex *__return_storage_ptr__,QListViewPrivate *this,QRect *target,
          QList<QModelIndex> *candidates)

{
  undefined4 uVar1;
  quintptr qVar2;
  bool bVar3;
  int iVar4;
  QModelIndex *pQVar5;
  QPoint QVar6;
  long lVar7;
  QModelIndex *this_00;
  int iVar8;
  int iVar9;
  long lVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  int local_6c;
  QListViewItem local_4c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  pQVar5 = (candidates->d).ptr;
  local_6c = 0x7fffffff;
  this_00 = pQVar5;
  do {
    if (this_00 == pQVar5 + (candidates->d).size) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    bVar3 = QModelIndex::isValid(this_00);
    if (bVar3) {
      indexToListViewItem(&local_4c,this,this_00);
      QVar11 = QListViewItem::rect(&local_4c);
      QVar6 = QRect::center(target);
      lVar10 = QVar11._0_8_ >> 0x20;
      lVar7 = QVar11._8_8_ >> 0x20;
      if ((QVar6.xp.m_i.m_i < QVar11.x1.m_i.m_i) ||
         (QVar6 = QRect::center(target), QVar11.x2.m_i.m_i <= QVar6.xp.m_i.m_i)) {
        iVar9 = (int)((lVar7 + lVar10) / 2);
        iVar8 = (int)(((long)QVar11.x2.m_i.m_i + (long)QVar11.x1.m_i.m_i) / 2);
        if (((target->x1).m_i <= iVar8) && (iVar8 < (target->x2).m_i)) goto LAB_00514513;
        QVar6 = QRect::center(target);
        if (((QVar6.yp.m_i.m_i < QVar11.y1.m_i.m_i) ||
            (QVar6 = QRect::center(target), QVar11.y2.m_i.m_i <= QVar6.yp.m_i.m_i)) &&
           ((iVar9 < (target->y1).m_i || ((target->y2).m_i <= iVar9)))) {
          QVar6 = QRect::center(target);
          iVar8 = iVar8 - QVar6.xp.m_i;
          iVar9 = iVar9 - QVar6.yp.m_i;
          iVar4 = -iVar8;
          if (0 < iVar8) {
            iVar4 = iVar8;
          }
          iVar8 = -iVar9;
          if (0 < iVar9) {
            iVar8 = iVar9;
          }
          iVar4 = iVar8 + iVar4;
        }
        else {
          QVar6 = QRect::center(target);
          iVar8 = iVar8 - QVar6.xp.m_i;
          iVar4 = -iVar8;
          if (0 < iVar8) {
            iVar4 = iVar8;
          }
        }
      }
      else {
        iVar9 = (int)((lVar7 + lVar10) / 2);
LAB_00514513:
        QVar6 = QRect::center(target);
        iVar9 = iVar9 - QVar6.yp.m_i;
        iVar4 = -iVar9;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
      }
      if (iVar4 < local_6c) {
        (__return_storage_ptr__->m).ptr = (this_00->m).ptr;
        iVar9 = this_00->c;
        qVar2 = this_00->i;
        uVar1 = *(undefined4 *)((long)&this_00->i + 4);
        __return_storage_ptr__->r = this_00->r;
        __return_storage_ptr__->c = iVar9;
        *(int *)&__return_storage_ptr__->i = (int)qVar2;
        *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar1;
        local_6c = iVar4;
      }
    }
    this_00 = this_00 + 1;
    pQVar5 = (candidates->d).ptr;
  } while( true );
}

Assistant:

QModelIndex QListViewPrivate::closestIndex(const QRect &target,
                                           const QList<QModelIndex> &candidates) const
{
    int distance = 0;
    int shortest = INT_MAX;
    QModelIndex closest;
    QList<QModelIndex>::const_iterator it = candidates.begin();

    for (; it != candidates.end(); ++it) {
        if (!(*it).isValid())
            continue;

        const QRect indexRect = indexToListViewItem(*it).rect();

        //if the center x (or y) position of an item is included in the rect of the other item,
        //we define the distance between them as the difference in x (or y) of their respective center.
        // Otherwise, we use the nahattan  length between the 2 items
        if ((target.center().x() >= indexRect.x() && target.center().x() < indexRect.right())
            || (indexRect.center().x() >= target.x() && indexRect.center().x() < target.right())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().y() - target.center().y());
        } else if ((target.center().y() >= indexRect.y() && target.center().y() < indexRect.bottom())
            || (indexRect.center().y() >= target.y() && indexRect.center().y() < target.bottom())) {
                //one item's center is at the vertical of the other
                distance = qAbs(indexRect.center().x() - target.center().x());
        } else {
            distance = (indexRect.center() - target.center()).manhattanLength();
        }
        if (distance < shortest) {
            shortest = distance;
            closest = *it;
        }
    }
    return closest;
}